

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conf.c
# Opt level: O1

void conf_del_str_str(Conf *conf,int primary,char *secondary)

{
  conf_entry *entry;
  key key;
  int local_20 [2];
  char *local_18;
  
  if (subkeytypes[primary] != 3) {
    __assert_fail("subkeytypes[primary] == TYPE_STR",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/conf.c",
                  0x1d6,"void conf_del_str_str(Conf *, int, const char *)");
  }
  if (valuetypes[primary] == 3) {
    local_20[0] = primary;
    local_18 = secondary;
    entry = (conf_entry *)find234(conf->tree,local_20,(cmpfn234)0x0);
    if (entry != (conf_entry *)0x0) {
      del234(conf->tree,entry);
      free_entry(entry);
    }
    return;
  }
  __assert_fail("valuetypes[primary] == TYPE_STR",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/conf.c",
                0x1d7,"void conf_del_str_str(Conf *, int, const char *)");
}

Assistant:

void conf_del_str_str(Conf *conf, int primary, const char *secondary)
{
    struct key key;
    struct conf_entry *entry;

    assert(subkeytypes[primary] == TYPE_STR);
    assert(valuetypes[primary] == TYPE_STR);
    key.primary = primary;
    key.secondary.s = (char *)secondary;
    entry = find234(conf->tree, &key, NULL);
    if (entry) {
        del234(conf->tree, entry);
        free_entry(entry);
    }
 }